

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qprogressbar.cpp
# Opt level: O3

void __thiscall QProgressBar::setValue(QProgressBar *this,int value)

{
  QProgressBarPrivate *this_00;
  bool bVar1;
  long in_FS_OFFSET;
  anon_union_24_3_e3d07ef4_for_data local_98;
  code *local_78;
  undefined1 *local_70;
  QProgressBar *pQStack_68;
  undefined1 *local_60;
  anon_union_24_3_e3d07ef4_for_data aStack_58;
  undefined1 *local_40;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QProgressBarPrivate **)&(this->super_QWidget).field_0x8;
  if ((this_00->value != value) &&
     (((value <= this_00->maximum && (*(int *)&(this_00->super_QWidgetPrivate).field_0x254 <= value)
       ) || ((this_00->maximum == 0 && (*(int *)&(this_00->super_QWidgetPrivate).field_0x254 == 0)))
      ))) {
    this_00->value = value;
    local_78 = (code *)0x0;
    local_98._0_4_ = value;
    local_70 = (undefined1 *)&local_98;
    QMetaObject::activate((QObject *)this,&staticMetaObject,0,&local_78);
    if ((((this->super_QWidget).data)->widget_attributes & 0x8000) != 0) {
      local_40 = &DAT_aaaaaaaaaaaaaaaa;
      aStack_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      aStack_58._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_60 = &DAT_aaaaaaaaaaaaaaaa;
      aStack_58.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
      local_70 = &DAT_aaaaaaaaaaaaaaaa;
      pQStack_68 = (QProgressBar *)&DAT_aaaaaaaaaaaaaaaa;
      ::QVariant::QVariant((QVariant *)&local_98,value);
      local_70._0_4_ = 0x80c1;
      local_60 = (undefined1 *)CONCAT44(local_60._4_4_,0xffffffff);
      local_78 = QTextDocument::setMarkdown;
      pQStack_68 = this;
      ::QVariant::QVariant((QVariant *)&aStack_58,(QVariant *)&local_98);
      local_70 = (undefined1 *)CONCAT44(local_70._4_4_,0x800e);
      ::QVariant::~QVariant((QVariant *)&local_98);
      QAccessible::updateAccessibility((QAccessibleEvent *)&local_78);
      QAccessibleValueChangeEvent::~QAccessibleValueChangeEvent
                ((QAccessibleValueChangeEvent *)&local_78);
    }
    bVar1 = QProgressBarPrivate::repaintRequired(this_00);
    if (bVar1) {
      QWidget::repaint(&this->super_QWidget);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QProgressBar::setValue(int value)
{
    Q_D(QProgressBar);
    if (d->value == value
            || ((value > d->maximum || value < d->minimum)
                && (d->maximum != 0 || d->minimum != 0)))
        return;
    d->value = value;
    emit valueChanged(value);
#if QT_CONFIG(accessibility)
    if (isVisible()) {
        QAccessibleValueChangeEvent event(this, value);
        QAccessible::updateAccessibility(&event);
    }
#endif
    if (d->repaintRequired())
        repaint();
}